

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

bool __thiscall Omega_h::InputMap::is<bool>(InputMap *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  InputScalar *this_00;
  bool local_49;
  bool local_39;
  __shared_ptr_access<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_38;
  bool ignored;
  shared_ptr<Omega_h::Input> *sptr;
  _Self local_28;
  iterator it;
  string *name_local;
  InputMap *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
       ::find(&this->map,name);
  sptr = (shared_ptr<Omega_h::Input> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
         ::end(&this->map);
  bVar1 = std::operator==(&local_28,(_Self *)&sptr);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>
             ::operator->(&local_28);
    p_Stack_38 = (__shared_ptr_access<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &ppVar2->second;
    peVar3 = std::__shared_ptr_access<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(p_Stack_38);
    bVar1 = is_type<Omega_h::InputScalar>(peVar3);
    local_49 = false;
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(p_Stack_38);
      this_00 = as_type<Omega_h::InputScalar>(peVar3);
      local_49 = InputScalar::as(this_00,&local_39);
    }
    this_local._7_1_ = local_49;
  }
  return this_local._7_1_;
}

Assistant:

bool InputMap::is(std::string const& name) {
  auto const it = map.find(name);
  if (it == map.end()) return false;
  auto const& sptr = it->second;
  ScalarType ignored;
  return is_type<InputScalar>(*sptr) && as_type<InputScalar>(*sptr).as(ignored);
}